

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int Curl_resolv_getsock(connectdata *conn,curl_socket_t *socks)

{
  curl_socket_t *socks_local;
  connectdata *conn_local;
  
  if ((*(ulong *)&(conn->data->set).field_0x910 >> 0x37 & 1) == 0) {
    conn_local._4_4_ = Curl_resolver_getsock(conn,socks);
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_resolv_getsock(struct connectdata *conn,
                        curl_socket_t *socks)
{
#ifdef CURLRES_ASYNCH
  if(conn->data->set.doh)
    /* nothing to wait for during DOH resolve, those handles have their own
       sockets */
    return GETSOCK_BLANK;
  return Curl_resolver_getsock(conn, socks);
#else
  (void)conn;
  (void)socks;
  return GETSOCK_BLANK;
#endif
}